

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O2

void Ga2_StructAnalize(Gia_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInter,Vec_Int_t *vNewPPis)

{
  int iVar1;
  uint uVar2;
  int v;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  char *__format;
  
  iVar5 = 0;
  while ((iVar5 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffbfffffff;
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar5 < vFront->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vFront,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffbfffffff | 0x40000000;
  }
  for (iVar5 = 0; iVar5 < vInter->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vInter,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000000000000;
  }
  for (iVar5 = 0; iVar5 < vNewPPis->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vNewPPis,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000000000000;
  }
  iVar5 = 0;
  do {
    if (vNewPPis->nSize <= iVar5) {
      return;
    }
    iVar1 = Vec_IntEntry(vNewPPis,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      return;
    }
    iVar5 = iVar5 + 1;
    printf("Selected PPI %3d : ");
    uVar2 = Gia_ObjId(p,pGVar3);
    printf("%6d ",(ulong)uVar2);
    putchar(10);
    Ga2_ObjLeaves(p,pGVar3);
    for (iVar1 = 0; iVar1 < Ga2_ObjLeaves::v.nSize; iVar1 = iVar1 + 1) {
      v = Vec_IntEntry(&Ga2_ObjLeaves::v,iVar1);
      pGVar3 = Gia_ManObj(p,v);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      printf("    ");
      uVar2 = Gia_ObjId(p,pGVar3);
      printf("%6d ",(ulong)uVar2);
      uVar4 = *(ulong *)pGVar3 & 0x4000000040000000;
      if (uVar4 == 0) {
        __format = "free variable";
      }
      else {
        __format = "selected PPI";
        if (uVar4 != 0x4000000040000000) {
          if (uVar4 == 0x4000000000000000) {
            __format = "abstracted node";
          }
          else {
            __format = "frontier (original PI or PPI)";
          }
        }
      }
      printf(__format);
      putchar(10);
    }
  } while( true );
}

Assistant:

void Ga2_StructAnalize( Gia_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInter, Vec_Int_t * vNewPPis )
{
    Vec_Int_t * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    // clean labels
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = pObj->fMark1 = 0;
    // label frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
        pObj->fMark0 = 1, pObj->fMark1 = 0;
    // label objects
    Gia_ManForEachObjVec( vInter, p, pObj, i )
        pObj->fMark1 = 0, pObj->fMark1 = 1;
    // label selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
        pObj->fMark1 = 1, pObj->fMark1 = 1;
    // explore selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
    {
        printf( "Selected PPI %3d : ", i+1 );
        printf( "%6d ",  Gia_ObjId(p, pObj) );
        printf( "\n" );
        vFanins = Ga2_ObjLeaves( p, pObj );
        Gia_ManForEachObjVec( vFanins, p, pFanin, k )
        {
            printf( "    " );
            printf( "%6d ", Gia_ObjId(p, pFanin) );
            if ( pFanin->fMark0 && pFanin->fMark1 )
                printf( "selected PPI" );
            else if ( pFanin->fMark0 && !pFanin->fMark1 )
                printf( "frontier (original PI or PPI)" );
            else if ( !pFanin->fMark0 &&  pFanin->fMark1 )
                printf( "abstracted node" );
            else if ( !pFanin->fMark0 && !pFanin->fMark1 )
                printf( "free variable" );
            printf( "\n" );
        }
    }
}